

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O1

lexeme_t<cfgfile::string_trait_t> * __thiscall
cfgfile::lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme
          (lexeme_t<cfgfile::string_trait_t> *__return_storage_ptr__,
          lexical_analyzer_t<cfgfile::string_trait_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  input_stream_t<cfgfile::string_trait_t> *this_00;
  pos_t pVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char_t cVar7;
  bool bVar8;
  exception_t<cfgfile::string_trait_t> *peVar9;
  pos_t pos;
  pos_t pos_00;
  pos_t pos_01;
  int iVar10;
  char_t new_char;
  string_t result;
  char_t local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  undefined1 *local_288;
  long local_280;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  string *local_260;
  lexeme_t<cfgfile::string_trait_t> *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string_t local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  string_t local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_190 = &local_180;
  local_188 = 0;
  local_180 = 0;
  skip_spaces(this);
  this_00 = this->m_stream;
  pVar2 = this_00->m_column_number;
  this->m_line_number = this_00->m_line_number;
  this->m_column_number = pVar2;
  bVar6 = input_stream_t<cfgfile::string_trait_t>::at_end(this_00);
  if (bVar6) {
    paVar1 = &local_2a8.field_2;
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_type = null;
    (__return_storage_ptr__->m_value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_value).field_2;
    local_2a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_value,paVar1,paVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p,
                      CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                               local_2a8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    local_260 = (string *)&__return_storage_ptr__->m_value;
    local_268 = &(__return_storage_ptr__->m_value).field_2;
    bVar5 = true;
    bVar6 = false;
    local_258 = __return_storage_ptr__;
    bVar4 = false;
    do {
      cVar7 = input_stream_t<cfgfile::string_trait_t>::get(this->m_stream);
      bVar8 = bVar4;
      if (cVar7 == const_t<cfgfile::string_trait_t>::c_quotes) {
        iVar10 = 3;
        if (bVar6) goto LAB_0011c8f0;
        if (!bVar5) {
LAB_0011c7bb:
          iVar10 = 3;
          input_stream_t<cfgfile::string_trait_t>::put_back(this->m_stream,cVar7);
          goto LAB_0011c8f0;
        }
        bVar6 = true;
LAB_0011c857:
        bVar8 = input_stream_t<cfgfile::string_trait_t>::at_end(this->m_stream);
        if (bVar8) {
          if (bVar6) {
            peVar9 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1b0,"Unfinished quoted lexeme. ","");
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,local_1b0._M_dataplus._M_p,
                       local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d0,"End of file riched. In file \"","");
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f0,local_1d0._M_dataplus._M_p,
                       local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
            std::operator+(&local_130,&local_150,&local_1f0);
            std::operator+(&local_110,&local_130,&this->m_stream->m_file_name);
            local_288 = local_278;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"\" on line ","");
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_210,local_288,local_288 + local_280);
            std::operator+(&local_f0,&local_110,&local_210);
            string_trait_t::to_string_abi_cxx11_
                      (&local_170,(string_trait_t *)this->m_line_number,pos);
            std::operator+(&local_2a8,&local_f0,&local_170);
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,".","");
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_250,local_230._M_dataplus._M_p,
                       local_230._M_dataplus._M_p + local_230._M_string_length);
            std::operator+(&local_90,&local_2a8,&local_250);
            exception_t<cfgfile::string_trait_t>::exception_t(peVar9,&local_90);
            __cxa_throw(peVar9,&exception_t<cfgfile::string_trait_t>::typeinfo,
                        exception_t<cfgfile::string_trait_t>::~exception_t);
          }
          iVar10 = 3;
          bVar8 = bVar4;
          if (local_188 == 0) {
            paVar1 = &local_2a8.field_2;
            local_2a8._M_string_length = 0;
            local_2a8.field_2._M_local_buf[0] = '\0';
            local_258->m_type = null;
            (local_258->m_value)._M_dataplus._M_p = (pointer)local_268;
            local_2a8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>(local_260,paVar1,paVar1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != paVar1) {
LAB_0011c8c4:
              operator_delete(local_2a8._M_dataplus._M_p,
                              CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                                       local_2a8.field_2._M_local_buf[0]) + 1);
            }
LAB_0011c8d1:
            iVar10 = 1;
            bVar8 = bVar4;
          }
        }
        else {
          iVar10 = 0;
          bVar8 = false;
          if (!bVar4) {
            bVar8 = bVar4;
            bVar5 = false;
          }
        }
      }
      else {
        if (cVar7 == const_t<cfgfile::string_trait_t>::c_back_slash) {
          local_2a9 = '\0';
          if ((bVar6) && (bVar8 = process_back_slash(this,&local_2a9), !bVar8)) {
            peVar9 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f0,"Unrecognized back-slash sequence: \"\\","");
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b0,local_1f0._M_dataplus._M_p,
                       local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x01');
            std::operator+(&local_150,&local_1b0,&local_1d0);
            local_288 = local_278;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_288,"\". In file \"","");
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_210,local_288,local_288 + local_280);
            std::operator+(&local_130,&local_150,&local_210);
            std::operator+(&local_110,&local_130,&this->m_stream->m_file_name);
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"\" on line ","");
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_170,local_250._M_dataplus._M_p,
                       local_250._M_dataplus._M_p + local_250._M_string_length);
            std::operator+(&local_f0,&local_110,&local_170);
            string_trait_t::to_string_abi_cxx11_
                      (&local_230,(string_trait_t *)this->m_line_number,pos_00);
            std::operator+(&local_2a8,&local_f0,&local_230);
            local_d0 = local_c0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,".","");
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,local_d0,local_d0 + local_c8);
            std::operator+(&local_50,&local_2a8,&local_b0);
            exception_t<cfgfile::string_trait_t>::exception_t(peVar9,&local_50);
            __cxa_throw(peVar9,&exception_t<cfgfile::string_trait_t>::typeinfo,
                        exception_t<cfgfile::string_trait_t>::~exception_t);
          }
          std::__cxx11::string::push_back((char)&local_190);
          goto LAB_0011c857;
        }
        if (cVar7 == const_t<cfgfile::string_trait_t>::c_begin_tag) {
          if (local_188 == 0) {
            local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_2a8,'\x01');
            local_258->m_type = start;
            (local_258->m_value)._M_dataplus._M_p = (pointer)local_268;
            std::__cxx11::string::_M_construct<char*>
                      (local_260,local_2a8._M_dataplus._M_p,
                       local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
            goto LAB_0011c945;
          }
LAB_0011c7b1:
          if (!bVar6) goto LAB_0011c7bb;
LAB_0011c847:
          std::__cxx11::string::push_back((char)&local_190);
          goto LAB_0011c857;
        }
        if (cVar7 == const_t<cfgfile::string_trait_t>::c_end_tag) {
          if (local_188 != 0) goto LAB_0011c7b1;
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_2a8,'\x01');
          local_258->m_type = finish;
          (local_258->m_value)._M_dataplus._M_p = (pointer)local_268;
          std::__cxx11::string::_M_construct<char*>
                    (local_260,local_2a8._M_dataplus._M_p,
                     local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
LAB_0011c945:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) goto LAB_0011c8c4;
          goto LAB_0011c8d1;
        }
        if ((cVar7 == const_t<cfgfile::string_trait_t>::c_space) ||
           (cVar7 == const_t<cfgfile::string_trait_t>::c_tab)) {
          iVar10 = 3;
          if (bVar6) goto LAB_0011c847;
        }
        else if ((cVar7 == const_t<cfgfile::string_trait_t>::c_carriage_return) ||
                (cVar7 == const_t<cfgfile::string_trait_t>::c_line_feed)) {
          iVar10 = 3;
          if (bVar6) {
            peVar9 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1b0,"Unfinished quoted lexeme. ","");
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,local_1b0._M_dataplus._M_p,
                       local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d0,"New line detected. In file \"","");
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f0,local_1d0._M_dataplus._M_p,
                       local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
            std::operator+(&local_130,&local_150,&local_1f0);
            std::operator+(&local_110,&local_130,&this->m_stream->m_file_name);
            local_288 = local_278;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"\" on line ","");
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_210,local_288,local_288 + local_280);
            std::operator+(&local_f0,&local_110,&local_210);
            string_trait_t::to_string_abi_cxx11_
                      (&local_170,(string_trait_t *)this->m_line_number,pos_01);
            std::operator+(&local_2a8,&local_f0,&local_170);
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,".","");
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_250,local_230._M_dataplus._M_p,
                       local_230._M_dataplus._M_p + local_230._M_string_length);
            std::operator+(&local_70,&local_2a8,&local_250);
            exception_t<cfgfile::string_trait_t>::exception_t(peVar9,&local_70);
            __cxa_throw(peVar9,&exception_t<cfgfile::string_trait_t>::typeinfo,
                        exception_t<cfgfile::string_trait_t>::~exception_t);
          }
        }
        else {
          if (((cVar7 != const_t<cfgfile::string_trait_t>::c_vertical_bar) || (bVar6)) ||
             (bVar8 = input_stream_t<cfgfile::string_trait_t>::at_end(this->m_stream), bVar8))
          goto LAB_0011c847;
          cVar7 = input_stream_t<cfgfile::string_trait_t>::get(this->m_stream);
          if (cVar7 == const_t<cfgfile::string_trait_t>::c_vertical_bar) {
            skip_one_line_comment(this);
LAB_0011c97f:
            if (bVar5) {
              skip_spaces(this);
              bVar4 = true;
              goto LAB_0011c9c1;
            }
            iVar10 = 3;
            bVar4 = true;
            bVar3 = false;
          }
          else {
            if (cVar7 == const_t<cfgfile::string_trait_t>::c_sharp) {
              skip_multi_line_comment(this);
              goto LAB_0011c97f;
            }
            std::__cxx11::string::push_back((char)&local_190);
            input_stream_t<cfgfile::string_trait_t>::put_back(this->m_stream,cVar7);
LAB_0011c9c1:
            iVar10 = 0;
            bVar3 = true;
          }
          bVar8 = bVar4;
          if (bVar3) goto LAB_0011c857;
        }
      }
LAB_0011c8f0:
      __return_storage_ptr__ = local_258;
      bVar4 = bVar8;
    } while (iVar10 == 0);
    if (iVar10 == 3) {
      local_258->m_type = string;
      (local_258->m_value)._M_dataplus._M_p = (pointer)local_268;
      std::__cxx11::string::_M_construct<char*>(local_260,local_190,local_190 + local_188);
    }
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

lexeme_t< Trait > next_lexeme()
	{
		typename Trait::string_t result;

		bool quoted_lexeme = false;
		bool first_symbol = true;
		bool skip_comment = false;

		skip_spaces();

		m_line_number = m_stream.line_number();
		m_column_number = m_stream.column_number();

		if( m_stream.at_end() )
			return lexeme_t< Trait >( lexeme_type_t::null,
				typename Trait::string_t() );

		while( true )
		{
			typename Trait::char_t ch = m_stream.get();

			if( ch == const_t< Trait >::c_quotes )
			{
				if( quoted_lexeme )
					break;
				else if( first_symbol )
					quoted_lexeme = true;
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_back_slash )
			{
				typename Trait::char_t new_char( 0x00 );

				if( !quoted_lexeme )
					result.push_back( ch );
				else if( process_back_slash( new_char ) )
					result.push_back( new_char );
				else
					throw exception_t< Trait >(
						Trait::from_ascii( "Unrecognized back-slash "
							"sequence: \"\\" ) +
						typename Trait::string_t( 1, new_char ) +
						Trait::from_ascii( "\". In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
			}
			else if( ch == const_t< Trait >::c_begin_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::start,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_end_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::finish,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_space ||
				ch == const_t< Trait >::c_tab )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_carriage_return ||
				ch == const_t< Trait >::c_line_feed )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "New line detected. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_vertical_bar )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					if( !m_stream.at_end() )
					{
						typename Trait::char_t next_char = m_stream.get();

						if( next_char == const_t< Trait >::c_vertical_bar )
						{
							skip_comment = true;

							skip_one_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else if( next_char == const_t< Trait >::c_sharp )
						{
							skip_comment = true;

							skip_multi_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else
						{
							result.push_back( ch );

							m_stream.put_back( next_char );
						}
					}
					else
						result.push_back( ch );
				}
			}
			else
				result.push_back( ch );

			if( m_stream.at_end() )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "End of file riched. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::null,
						typename Trait::string_t() );
				else
					break;
			}

			if( !skip_comment )
				first_symbol = false;
			else
				skip_comment = false;
		}

		return lexeme_t< Trait >( lexeme_type_t::string, result );
	}